

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O2

void __thiscall
tchecker::
pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
::pool_t(pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
         *this,size_t alloc_nb,size_t alloc_size)

{
  size_t sVar1;
  invalid_argument *this_00;
  
  this->_alloc_nb = alloc_nb;
  sVar1 = 0x10;
  if (0x10 < alloc_size) {
    sVar1 = alloc_size;
  }
  this->_alloc_size = sVar1;
  this->_block_size = sVar1 * alloc_nb + 8;
  this->_blocks_count = 0;
  this->_free_head = (char *)0x0;
  this->_block_head = (char *)0x0;
  this->_raw_head = (char *)0x0;
  this->_raw_end = (char *)0x0;
  (this->_collectables).
  super__Vector_base<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_collectables).
  super__Vector_base<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_collectables).
  super__Vector_base<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (alloc_nb != 0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"allocation number should be >= 1");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

pool_t(std::size_t alloc_nb, std::size_t alloc_size)
      : _alloc_nb(alloc_nb), _alloc_size(std::max(alloc_size, MIN_ALLOC_SIZE)),
        _block_size(_alloc_nb * _alloc_size + sizeof(void *)), _blocks_count(0), _free_head(nullptr), _block_head(nullptr),
        _raw_head(nullptr), _raw_end(nullptr)
  {
    if (_alloc_nb < 1)
      throw std::invalid_argument("allocation number should be >= 1");
  }